

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fec-group.c
# Opt level: O0

void fec_group_init(fec_group_t *group,uchar fec_k,uchar fec_n,uchar seq,unsigned_long tstamp,
                   unsigned_short fec_len)

{
  uchar *puVar1;
  uint *puVar2;
  int local_28;
  int i;
  unsigned_short fec_len_local;
  unsigned_long tstamp_local;
  uchar seq_local;
  uchar fec_n_local;
  uchar fec_k_local;
  fec_group_t *group_local;
  
  if (group == (fec_group_t *)0x0) {
    __assert_fail("group != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec-group.c",0x19,
                  "void fec_group_init(fec_group_t *, unsigned char, unsigned char, unsigned char, unsigned long, unsigned short)"
                 );
  }
  group->fec_k = fec_k;
  group->fec_n = fec_n;
  group->seq = seq;
  group->tstamp = tstamp;
  group->fec_len = fec_len;
  group->rcvd_pkts = '\0';
  puVar1 = (uchar *)malloc((ulong)fec_n * (ulong)fec_len);
  group->buf = puVar1;
  if (group->buf != (uchar *)0x0) {
    puVar2 = (uint *)malloc((ulong)fec_n << 2);
    group->lengths = puVar2;
    if (group->lengths != (uint *)0x0) {
      for (local_28 = 0; local_28 < (int)(uint)fec_n; local_28 = local_28 + 1) {
        group->lengths[local_28] = 0;
      }
      group->decoded = 0;
      return;
    }
    __assert_fail("group->lengths != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec-group.c",0x25,
                  "void fec_group_init(fec_group_t *, unsigned char, unsigned char, unsigned char, unsigned long, unsigned short)"
                 );
  }
  __assert_fail("group->buf != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec-group.c",0x23,
                "void fec_group_init(fec_group_t *, unsigned char, unsigned char, unsigned char, unsigned long, unsigned short)"
               );
}

Assistant:

void fec_group_init(fec_group_t *group,
                    unsigned char fec_k,
                    unsigned char fec_n,
                    unsigned char seq,
                    unsigned long tstamp,
                    unsigned short fec_len) {
  assert(group != NULL);
  
  group->fec_k = fec_k;
  group->fec_n = fec_n;
  group->seq = seq;
  group->tstamp = tstamp;
  group->fec_len = fec_len;
  group->rcvd_pkts = 0;

  group->buf = malloc(sizeof(unsigned char) * fec_n * fec_len);
  assert(group->buf != NULL);
  group->lengths = malloc(sizeof(unsigned int) * fec_n);
  assert(group->lengths != NULL);

  /* init pointers */
  int i;
  for (i = 0; i < fec_n; i++) {
    group->lengths[i] = 0;
  }

  group->decoded = 0;
}